

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>,_1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::assign_op<double,double>>
               (Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>
                *dst,CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *src,assign_op<double,_double> *func)

{
  undefined8 func_00;
  Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>
  *dstExpr;
  undefined1 local_78 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  *src_local;
  Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>
  *dst_local;
  
  srcEvaluator._8_8_ = func;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::evaluator((evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_30,src);
  resize_if_allowed<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>,_1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            (dst,src,(assign_op<double,_double> *)srcEvaluator._8_8_);
  evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>
  ::evaluator((evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
               *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator._8_8_;
  dstExpr = EigenBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>
            ::const_cast_derived
                      ((EigenBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                        *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_78,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_78);
  evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>
  ::~evaluator((evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~evaluator((evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}